

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::MakeEchoProgress(cmMakefileTargetGenerator *this,EchoProgress *progress)

{
  ostream *poVar1;
  ostringstream progressArg;
  long *local_1b0 [2];
  long local_1a0 [2];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this->LocalGenerator);
  std::__cxx11::string::_M_assign((string *)progress);
  std::__cxx11::string::append((char *)progress);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"$(CMAKE_PROGRESS_",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&progress->Arg,(string *)local_1b0);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void cmMakefileTargetGenerator::MakeEchoProgress(
  cmLocalUnixMakefileGenerator3::EchoProgress& progress) const
{
  progress.Dir = this->LocalGenerator->GetBinaryDirectory();
  progress.Dir += "/CMakeFiles";
  std::ostringstream progressArg;
  progressArg << "$(CMAKE_PROGRESS_" << this->NumberOfProgressActions << ")";
  progress.Arg = progressArg.str();
}